

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void dump_row(long count,int numinrow,int *chs)

{
  int iVar1;
  ushort **ppuVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  int local_1c;
  
  printf("%08lX:",in_RDI - in_ESI);
  if (0 < in_ESI) {
    for (local_1c = 0; iVar1 = in_ESI, local_1c < in_ESI; local_1c = local_1c + 1) {
      if (local_1c == 8) {
        printf(" :");
      }
      printf(" %02X",(ulong)*(uint *)(in_RDX + (long)local_1c * 4));
    }
    while (local_1c = iVar1, local_1c < 0x10) {
      if (local_1c == 8) {
        printf(" :");
      }
      printf("   ");
      iVar1 = local_1c + 1;
    }
    printf("  ");
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[*(int *)(in_RDX + (long)local_1c * 4)] & 0x4000) == 0) {
        printf(".");
      }
      else {
        printf("%c",(ulong)*(uint *)(in_RDX + (long)local_1c * 4));
      }
    }
  }
  printf("\n");
  return;
}

Assistant:

static void dump_row(long count, int numinrow, int *chs)
{
  int i;

  printf("%08lX:", count - numinrow);

  if (numinrow > 0) {
    for (i = 0; i < numinrow; i++) {
      if (i == 8) {
        printf(" :");
      }
      printf(" %02X", chs[i]);
    }
    for (i = numinrow; i < 16; i++) {
      if (i == 8) {
        printf(" :");
      }
      printf("   ");
    }
    printf("  ");
    for (i = 0; i < numinrow; i++) {
      if (isprint(chs[i])) {
        printf("%c", chs[i]);
      } else {
        printf(".");
      }
    }
  }
  printf("\n");
}